

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O0

void sysbvm_orderedCollection_add
               (sysbvm_context_t *context,sysbvm_tuple_t orderedCollection,sysbvm_tuple_t element)

{
  _Bool _Var1;
  sysbvm_size_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_array_t *storage;
  size_t capacity;
  size_t size;
  sysbvm_orderedCollection_t *orderedCollectionObject;
  sysbvm_tuple_t element_local;
  sysbvm_tuple_t orderedCollection_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(orderedCollection);
  if (_Var1) {
    sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(orderedCollection + 0x10));
    sVar3 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(orderedCollection + 0x18));
    if (sVar3 <= sVar2) {
      sysbvm_orderedCollection_increaseCapacity(context,orderedCollection);
    }
    *(sysbvm_tuple_t *)(*(long *)(orderedCollection + 0x18) + 0x10 + sVar2 * 8) = element;
    sVar4 = sysbvm_tuple_size_encode(context,sVar2 + 1);
    *(sysbvm_tuple_t *)(orderedCollection + 0x10) = sVar4;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_orderedCollection_add(sysbvm_context_t *context, sysbvm_tuple_t orderedCollection, sysbvm_tuple_t element)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection))
        return;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    size_t capacity = sysbvm_tuple_getSizeInSlots(orderedCollectionObject->storage);
    if(size >= capacity)
        sysbvm_orderedCollection_increaseCapacity(context, orderedCollection);

    sysbvm_array_t *storage = (sysbvm_array_t*)orderedCollectionObject->storage;
    storage->elements[size] = element;
    orderedCollectionObject->size = sysbvm_tuple_size_encode(context, size + 1);
}